

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O3

Gia_Man_t * Cec_ManSatSweeping(Gia_Man_t *pAig,Cec_ParFra_t *pPars,int fSilent)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *pGVar8;
  Cec_ManFra_t *p;
  Cec_ManSim_t *p_00;
  Cec_ManPat_t *pPat;
  Gia_Man_t *pGVar9;
  Cec_ParFra_t *pCVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  Gia_Man_t *pGVar18;
  double dVar19;
  double dVar20;
  timespec ts_1;
  long local_b0;
  Cec_ParSat_t local_80;
  timespec ts;
  
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    local_b0 = -1;
  }
  else {
    local_b0 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Gia_ManRandom(1);
  pGVar8 = Gia_ManDup(pAig);
  piVar2 = pAig->pNexts;
  pGVar8->pReprs = pAig->pReprs;
  pGVar8->pNexts = piVar2;
  pAig->pReprs = (Gia_Rpr_t *)0x0;
  pAig->pNexts = (int *)0x0;
  p = Cec_ManFraStart(pGVar8,pPars);
  iVar4 = pPars->fDualOut;
  if (iVar4 != 0) {
    pPars->fColorDiff = 1;
  }
  ts.tv_nsec = 0x300000014;
  ts.tv_sec._0_4_ = pPars->nWords;
  ts.tv_sec._4_4_ = pPars->nRounds;
  p_00 = Cec_ManSimStart(p->pAig,(Cec_ParSim_t *)&ts);
  local_80.nSatVarMax = 2000;
  local_80.nCallsRecycle = 200;
  local_80.fNonChrono = 0;
  local_80.fPolarFlip = 1;
  local_80.fCheckMiter = 0;
  local_80.fLearnCls = 0;
  local_80.nBTLimit = pPars->nBTLimit;
  local_80.fVerbose = pPars->fVeryVerbose;
  pPat = Cec_ManPatStart();
  pPat->fVerbose = pPars->fVeryVerbose;
  iVar5 = clock_gettime(3,(timespec *)&ts_1);
  if (iVar5 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_1.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts_1.tv_sec * -1000000;
  }
  if ((p->pAig->pReprs == (Gia_Rpr_t *)0x0) &&
     ((iVar5 = Cec_ManSimClassesPrepare(p_00,-1), iVar5 != 0 ||
      (iVar5 = Cec_ManSimClassesRefine(p_00), iVar5 != 0)))) {
    pGVar8 = p->pAig;
    Gia_ManStop(pGVar8);
    iVar5 = (int)pGVar8;
    p->pAig = (Gia_Man_t *)0x0;
    bVar3 = true;
    pGVar8 = (Gia_Man_t *)0x0;
  }
  else {
    iVar5 = 3;
    iVar6 = clock_gettime(3,(timespec *)&ts_1);
    if (iVar6 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
    }
    p->timeSim = p->timeSim + lVar13 + lVar12;
    if (0 < pPars->nItersMax) {
      piVar2 = &pPars->fDualOut;
      piVar1 = &pPars->fColorDiff;
      uVar17 = 0;
      do {
        iVar5 = clock_gettime(3,(timespec *)&ts_1);
        if (iVar5 < 0) {
          lVar12 = 1;
        }
        else {
          lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_1.tv_nsec),8);
          lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts_1.tv_sec * -1000000;
        }
        if (*piVar2 == 0) {
          uVar15 = 0;
        }
        else {
          uVar7 = Gia_ManEquivSetColors(p->pAig,pPars->fVeryVerbose);
          uVar15 = (ulong)uVar7;
        }
        pGVar8 = Cec_ManFraSpecReduction(p);
        if (pPars->fVeryVerbose != 0) {
          Gia_ManPrintStats(pGVar8,(Gps_Par_t *)0x0);
        }
        uVar17 = uVar17 + 1;
        piVar11 = piVar2;
        if (pGVar8->vCos->nSize != 0) {
          iVar5 = clock_gettime(3,(timespec *)&ts_1);
          if (iVar5 < 0) {
            lVar13 = 1;
          }
          else {
            lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_1.tv_nsec),8);
            lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + ts_1.tv_sec * -1000000;
          }
          if (pPars->fRunCSat == 0) {
            Cec_ManSatSolve(pPat,pGVar8,&local_80);
          }
          else {
            Cec_ManSatSolveCSat(pPat,pGVar8,&local_80);
          }
          iVar5 = clock_gettime(3,(timespec *)&ts_1);
          if (iVar5 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
          }
          p->timeSat = p->timeSat + lVar14 + lVar13;
          iVar5 = Cec_ManFraClassesUpdate(p,p_00,pPat,pGVar8);
          Gia_ManStop(pGVar8);
          pGVar8 = p->pAig;
          if (iVar5 == 0) {
            pGVar18 = pGVar8;
            pGVar9 = Gia_ManEquivReduceAndRemap(pGVar8,0,iVar4);
            iVar5 = (int)pGVar18;
            p->pAig = pGVar9;
            p_00->pAig = pGVar9;
            if (pGVar9 != (Gia_Man_t *)0x0) {
              Gia_ManStop(pGVar8);
              iVar5 = (int)pGVar8;
              if (p->pPars->fVerbose != 0) {
                pGVar8 = p->pAig;
                uVar7 = ~(pGVar8->vCos->nSize + pGVar8->vCis->nSize) + pGVar8->nObjs;
                Abc_Print(uVar7,"%3d : P =%7d. D =%7d. F =%6d. M = %7d. And =%8d. ",(ulong)uVar17,
                          (ulong)(uint)p->nAllProved,(ulong)(uint)p->nAllDisproved,
                          (ulong)(uint)p->nAllFailed,uVar15,(ulong)uVar7);
                iVar5 = 3;
                iVar6 = clock_gettime(3,(timespec *)&ts_1);
                if (iVar6 < 0) {
                  lVar13 = -1;
                }
                else {
                  lVar13 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
                }
                Abc_Print(iVar5,"%s =","Time");
                Abc_Print(iVar5,"%9.2f sec\n",SUB84((double)(lVar13 + lVar12) / 1000000.0,0));
              }
              pGVar8 = p->pAig;
              pCVar10 = p->pPars;
              if (pGVar8->nObjs != pGVar8->vCis->nSize + pGVar8->vCos->nSize + 1) {
                if (pCVar10->TimeLimit != 0) {
                  iVar5 = 3;
                  iVar6 = clock_gettime(3,(timespec *)&ts_1);
                  if (iVar6 < 0) {
                    lVar12 = -1;
                  }
                  else {
                    lVar12 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
                  }
                  pCVar10 = p->pPars;
                  if ((long)pCVar10->TimeLimit <= (lVar12 - local_b0) / 1000000) {
                    bVar3 = false;
                    goto LAB_005ccc41;
                  }
                }
                if (p->nAllDisproved + p->nAllProved < p->nAllFailed) {
                  bVar3 = true;
                  if (10000 < local_80.nBTLimit) goto LAB_005ccc41;
                  if (pPars->fSatSweeping != 0) {
                    if (pCVar10->fVerbose != 0) {
                      Abc_Print(iVar5,"Exceeded the limit on the number of conflicts (%d).\n");
                    }
                    goto LAB_005ccc41;
                  }
                  local_80.nBTLimit = local_80.nBTLimit * 10;
                  if (pCVar10->fVerbose != 0) {
                    Abc_Print(iVar5,"Increasing conflict limit to %d.\n");
                  }
                }
                if (*piVar2 != 0) {
                  pGVar8 = p->pAig;
                  iVar6 = (pGVar8->vCis->nSize - pGVar8->nObjs) + pGVar8->vCos->nSize;
                  if (*piVar1 == 0) {
                    if (iVar6 < -20000) goto LAB_005ccbfe;
                  }
                  else {
                    if ((-0x186a1 < iVar6) || (p->nAllDisproved + p->nAllProved < 10)) {
                      iVar6 = p->pPars->fVerbose;
                      goto joined_r0x005ccbc8;
                    }
LAB_005ccbfe:
                    if (9 < p->nAllDisproved + p->nAllProved) goto LAB_005ccc34;
                  }
                  if (p->pPars->fVerbose != 0) {
                    Abc_Print(iVar5,"Switching into normal mode.\n");
                  }
                  *piVar1 = 0;
                  goto LAB_005ccc2e;
                }
                goto LAB_005ccc34;
              }
              bVar3 = true;
              if (pCVar10->fVerbose != 0) {
                Abc_Print(iVar5,"Network after reduction is empty.\n");
              }
              goto LAB_005ccc41;
            }
            p->pAig = pGVar8;
          }
          else {
            Gia_ManStop(pGVar8);
            iVar5 = (int)pGVar8;
            p->pAig = (Gia_Man_t *)0x0;
            pGVar8 = (Gia_Man_t *)0x0;
          }
          bVar3 = true;
          goto LAB_005ccc4e;
        }
        Gia_ManStop(pGVar8);
        iVar5 = (int)pGVar8;
        if (p->pPars->fVerbose != 0) {
          Abc_Print(iVar5,"Considered all available candidate equivalences.\n");
        }
        bVar3 = true;
        if ((*piVar2 == 0) ||
           (pGVar8 = p->pAig, -2 < (pGVar8->vCis->nSize - pGVar8->nObjs) + pGVar8->vCos->nSize))
        goto LAB_005ccc41;
        iVar6 = p->pPars->fVerbose;
        if (*piVar1 == 0) {
          if (iVar6 != 0) {
            Abc_Print(iVar5,"Switching into normal mode.\n");
          }
        }
        else {
joined_r0x005ccbc8:
          piVar11 = piVar1;
          if (iVar6 != 0) {
            Abc_Print(iVar5,"Switching into reduced mode.\n");
          }
        }
LAB_005ccc2e:
        *piVar11 = 0;
LAB_005ccc34:
      } while ((int)uVar17 < pPars->nItersMax);
    }
    bVar3 = true;
LAB_005ccc41:
    pGVar8 = p->pAig;
  }
LAB_005ccc4e:
  if (p->pPars->fVerbose == 0) {
LAB_005ccf7c:
    p->pAig = (Gia_Man_t *)0x0;
    if (pGVar8 == (Gia_Man_t *)0x0) goto LAB_005ccf8c;
  }
  else {
    if (pGVar8 != (Gia_Man_t *)0x0) {
      iVar4 = ~(pAig->vCos->nSize + pAig->vCis->nSize) + pAig->nObjs;
      dVar20 = 1.0;
      dVar19 = 1.0;
      if (iVar4 != 0) {
        dVar19 = (double)iVar4;
      }
      iVar6 = pAig->nRegs;
      if (iVar6 != 0) {
        dVar20 = (double)iVar6;
      }
      Abc_Print(iVar5,
                "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
                ,SUB84(((double)(iVar4 - (~(pGVar8->vCos->nSize + pGVar8->vCis->nSize) +
                                         pGVar8->nObjs)) * 100.0) / dVar19,0),
                ((double)(iVar6 - pGVar8->nRegs) * 100.0) / dVar20);
      lVar12 = p->timeSim;
      iVar5 = 3;
      iVar4 = clock_gettime(3,(timespec *)&ts_1);
      if (iVar4 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
      }
      lVar14 = (long)(int)local_b0;
      Abc_Print(iVar5,"%s =","Sim ");
      dVar19 = 0.0;
      if (lVar13 - lVar14 != 0) {
        dVar19 = ((double)lVar12 * 100.0) / (double)(lVar13 - lVar14);
      }
      Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",SUB84((double)lVar12 / 1000000.0,0),dVar19);
      lVar12 = p->timeSat;
      lVar13 = pPat->timeTotalSave;
      iVar5 = 3;
      iVar4 = clock_gettime(3,(timespec *)&ts_1);
      if (iVar4 < 0) {
        lVar16 = -1;
      }
      else {
        lVar16 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
      }
      Abc_Print(iVar5,"%s =","Sat ");
      dVar19 = (double)(lVar12 - lVar13);
      dVar20 = 0.0;
      if (lVar16 - lVar14 != 0) {
        dVar20 = (dVar19 * 100.0) / (double)(lVar16 - lVar14);
      }
      Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",SUB84(dVar19 / 1000000.0,0),dVar20);
      lVar12 = pPat->timeTotalSave;
      lVar13 = p->timePat;
      iVar5 = 3;
      iVar4 = clock_gettime(3,(timespec *)&ts_1);
      if (iVar4 < 0) {
        lVar16 = -1;
      }
      else {
        lVar16 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
      }
      Abc_Print(iVar5,"%s =","Pat ");
      dVar19 = (double)(lVar12 + lVar13);
      dVar20 = 0.0;
      if (lVar16 - lVar14 != 0) {
        dVar20 = (dVar19 * 100.0) / (double)(lVar16 - lVar14);
      }
      Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",SUB84(dVar19 / 1000000.0,0),dVar20);
      iVar5 = 3;
      iVar4 = clock_gettime(3,(timespec *)&ts_1);
      if (iVar4 < 0) {
        iVar4 = -1;
      }
      else {
        iVar4 = (int)(ts_1.tv_nsec / 1000) + (int)ts_1.tv_sec * 1000000;
      }
      Abc_Print(iVar5,"%s =","Time");
      Abc_Print(iVar5,"%9.2f sec\n",SUB84((double)(iVar4 - (int)local_b0) / 1000000.0,0));
      pGVar8 = p->pAig;
      goto LAB_005ccf7c;
    }
    p->pAig = (Gia_Man_t *)0x0;
LAB_005ccf8c:
    iVar4 = p_00->iOut;
    if (-1 < iVar4) {
      if (fSilent == 0) {
        Abc_Print(iVar5,"Disproved at least one output of the miter (zero-based number %d).\n");
        iVar4 = p_00->iOut;
      }
      pPars->iOutFail = iVar4;
      pGVar8 = (Gia_Man_t *)0x0;
      goto LAB_005ccfe3;
    }
    pGVar8 = (Gia_Man_t *)0x0;
  }
  if ((fSilent == 0) && (p_00->pCexes != (void **)0x0)) {
    Abc_Print(iVar5,"Disproved %d outputs of the miter.\n",(ulong)(uint)p_00->nOuts);
  }
LAB_005ccfe3:
  if (fSilent == 0 && !bVar3) {
    iVar5 = 3;
    iVar4 = clock_gettime(3,(timespec *)&ts_1);
    if (iVar4 < 0) {
      dVar19 = -1.0;
    }
    else {
      dVar19 = (double)(ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000);
    }
    Abc_Print(iVar5,"Timed out after %d seconds.\n",
              (long)((int)(dVar19 - (double)local_b0) / 1000000));
  }
  pAig->pCexComb = p_00->pCexComb;
  p_00->pCexComb = (Abc_Cex_t *)0x0;
  Cec_ManSimStop(p_00);
  Cec_ManPatStop(pPat);
  Cec_ManFraStop(p);
  return pGVar8;
}

Assistant:

Gia_Man_t * Cec_ManSatSweeping( Gia_Man_t * pAig, Cec_ParFra_t * pPars, int fSilent )
{
    int fOutputResult = 0;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Gia_Man_t * pIni, * pSrm, * pTemp;
    Cec_ManFra_t * p;
    Cec_ManSim_t * pSim;
    Cec_ManPat_t * pPat;
    int i, fTimeOut = 0, nMatches = 0;
    abctime clk, clk2, clkTotal = Abc_Clock();

    // duplicate AIG and transfer equivalence classes
    Gia_ManRandom( 1 );
    pIni = Gia_ManDup(pAig);
    pIni->pReprs = pAig->pReprs; pAig->pReprs = NULL;
    pIni->pNexts = pAig->pNexts; pAig->pNexts = NULL;

    // prepare the managers
    // SAT sweeping
    p = Cec_ManFraStart( pIni, pPars );
    if ( pPars->fDualOut )
        pPars->fColorDiff = 1;
    // simulation
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords      = pPars->nWords;
    pParsSim->nFrames     = pPars->nRounds;
    pParsSim->fCheckMiter = pPars->fCheckMiter;
    pParsSim->fDualOut    = pPars->fDualOut;
    pParsSim->fVerbose    = pPars->fVerbose;
    pSim = Cec_ManSimStart( p->pAig, pParsSim );
    // SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVeryVerbose;
    // simulation patterns
    pPat = Cec_ManPatStart();
    pPat->fVerbose = pPars->fVeryVerbose;

    // start equivalence classes
clk = Abc_Clock();
    if ( p->pAig->pReprs == NULL )
    {
        if ( Cec_ManSimClassesPrepare(pSim, -1) || Cec_ManSimClassesRefine(pSim) )
        {
            Gia_ManStop( p->pAig );
            p->pAig = NULL;
            goto finalize;
        }
    }
p->timeSim += Abc_Clock() - clk;
    // perform solving
    for ( i = 1; i <= pPars->nItersMax; i++ )
    {
        clk2 = Abc_Clock();
        nMatches = 0;
        if ( pPars->fDualOut )
        {
            nMatches = Gia_ManEquivSetColors( p->pAig, pPars->fVeryVerbose );
//            p->pAig->pIso = Cec_ManDetectIsomorphism( p->pAig );
//            Gia_ManEquivTransform( p->pAig, 1 );
        }
        pSrm = Cec_ManFraSpecReduction( p ); 

//        Gia_AigerWrite( pSrm, "gia_srm.aig", 0, 0 );

        if ( pPars->fVeryVerbose )
            Gia_ManPrintStats( pSrm, NULL );
        if ( Gia_ManCoNum(pSrm) == 0 )
        {
            Gia_ManStop( pSrm );
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Considered all available candidate equivalences.\n" );
            if ( pPars->fDualOut && Gia_ManAndNum(p->pAig) > 0 )
            {
                if ( pPars->fColorDiff )
                {
                    if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Switching into reduced mode.\n" );
                    pPars->fColorDiff = 0;
                }
                else
                {
                    if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Switching into normal mode.\n" );
                    pPars->fDualOut = 0;
                }
                continue;
            }
            break;
        }
clk = Abc_Clock();
        if ( pPars->fRunCSat )
            Cec_ManSatSolveCSat( pPat, pSrm, pParsSat ); 
        else
            Cec_ManSatSolve( pPat, pSrm, pParsSat ); 
p->timeSat += Abc_Clock() - clk;
        if ( Cec_ManFraClassesUpdate( p, pSim, pPat, pSrm ) )
        {
            Gia_ManStop( pSrm );
            Gia_ManStop( p->pAig );
            p->pAig = NULL;
            goto finalize;
        }
        Gia_ManStop( pSrm );

        // update the manager
        pSim->pAig = p->pAig = Gia_ManEquivReduceAndRemap( pTemp = p->pAig, 0, pParsSim->fDualOut );
        if ( p->pAig == NULL )
        {
            p->pAig = pTemp;
            break;
        }
        Gia_ManStop( pTemp );
        if ( p->pPars->fVerbose )
        {
            Abc_Print( 1, "%3d : P =%7d. D =%7d. F =%6d. M = %7d. And =%8d. ", 
                i, p->nAllProved, p->nAllDisproved, p->nAllFailed, nMatches, Gia_ManAndNum(p->pAig) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
        if ( Gia_ManAndNum(p->pAig) == 0 )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Network after reduction is empty.\n" );
            break;
        }
        // check resource limits
        if ( p->pPars->TimeLimit && (Abc_Clock() - clkTotal)/CLOCKS_PER_SEC >= p->pPars->TimeLimit )
        {
            fTimeOut = 1;
            break;
        }
//        if ( p->nAllFailed && !p->nAllProved && !p->nAllDisproved )
        if ( p->nAllFailed > p->nAllProved + p->nAllDisproved )
        {
            if ( pParsSat->nBTLimit >= 10001 )
                break;
            if ( pPars->fSatSweeping )
            {
                if ( p->pPars->fVerbose )
                    Abc_Print( 1, "Exceeded the limit on the number of conflicts (%d).\n", pParsSat->nBTLimit );
                break;
            }
            pParsSat->nBTLimit *= 10;
            if ( p->pPars->fVerbose )
            {
                if ( p->pPars->fVerbose )
                    Abc_Print( 1, "Increasing conflict limit to %d.\n", pParsSat->nBTLimit );
                if ( fOutputResult )
                {
                    Gia_AigerWrite( p->pAig, "gia_cec_temp.aig", 0, 0 );
                    Abc_Print( 1,"The result is written into file \"%s\".\n", "gia_cec_temp.aig" );
                }
            }
        }
        if ( pPars->fDualOut && pPars->fColorDiff && (Gia_ManAndNum(p->pAig) < 100000 || p->nAllProved + p->nAllDisproved < 10) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Switching into reduced mode.\n" );
            pPars->fColorDiff = 0;
        }
//        if ( pPars->fDualOut && Gia_ManAndNum(p->pAig) < 20000 )
        else if ( pPars->fDualOut && (Gia_ManAndNum(p->pAig) < 20000 || p->nAllProved + p->nAllDisproved < 10) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Switching into normal mode.\n" );
            pPars->fColorDiff = 0;
            pPars->fDualOut = 0;
        }
    }
finalize:
    if ( p->pPars->fVerbose && p->pAig )
    {
        Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(p->pAig), 
            100.0*(Gia_ManAndNum(pAig)-Gia_ManAndNum(p->pAig))/(Gia_ManAndNum(pAig)?Gia_ManAndNum(pAig):1), 
            Gia_ManRegNum(pAig), Gia_ManRegNum(p->pAig), 
            100.0*(Gia_ManRegNum(pAig)-Gia_ManRegNum(p->pAig))/(Gia_ManRegNum(pAig)?Gia_ManRegNum(pAig):1) );
        Abc_PrintTimeP( 1, "Sim ", p->timeSim, Abc_Clock() - (int)clkTotal );
        Abc_PrintTimeP( 1, "Sat ", p->timeSat-pPat->timeTotalSave, Abc_Clock() - (int)clkTotal );
        Abc_PrintTimeP( 1, "Pat ", p->timePat+pPat->timeTotalSave, Abc_Clock() - (int)clkTotal );
        Abc_PrintTime( 1, "Time", (int)(Abc_Clock() - clkTotal) );
    }

    pTemp = p->pAig; p->pAig = NULL;
    if ( pTemp == NULL && pSim->iOut >= 0 )
    {
        if ( !fSilent )
        Abc_Print( 1, "Disproved at least one output of the miter (zero-based number %d).\n", pSim->iOut );
        pPars->iOutFail = pSim->iOut;
    }
    else if ( pSim->pCexes && !fSilent )
        Abc_Print( 1, "Disproved %d outputs of the miter.\n", pSim->nOuts );
    if ( fTimeOut && !fSilent )
        Abc_Print( 1, "Timed out after %d seconds.\n", (int)((double)Abc_Clock() - clkTotal)/CLOCKS_PER_SEC );

    pAig->pCexComb = pSim->pCexComb; pSim->pCexComb = NULL;
    Cec_ManSimStop( pSim );
    Cec_ManPatStop( pPat );
    Cec_ManFraStop( p );
    return pTemp;
}